

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O0

bool StringFormatter<char_const*,std::__cxx11::string>::output_using_operator<char_const*>
               (ostream *os,char **value)

{
  char **value_local;
  ostream *os_local;
  
  std::operator<<(os,*value);
  return true;
}

Assistant:

static bool output_using_operator(std::ostream& os, const T& value)
    {
        if constexpr (is_stream_insertable_v<T>) {
            os << value;
            return true;
        }
        return false;
    }